

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int cvLsJacBWrapper(sunrealtype t,N_Vector yB,N_Vector fyB,SUNMatrix JB,void *cvode_mem,
                   N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  int iVar1;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  
  iVar1 = cvLs_AccessLMemBCur(cvode_mem,"cvLsJacBWrapper",&cv_mem,&ca_mem,&cvB_mem,&cvlsB_mem);
  if (iVar1 == 0) {
    iVar1 = (*ca_mem->ca_IMget)(cv_mem,t,ca_mem->ca_ytmp,(N_Vector *)0x0);
    if (iVar1 == 0) {
      iVar1 = (*cvlsB_mem->jacB)(t,ca_mem->ca_ytmp,yB,fyB,JB,cvB_mem->cv_user_data,tmp1B,tmp2B,tmp3B
                                );
    }
    else {
      iVar1 = -1;
      cvProcessError(cv_mem,-1,0x98b,"cvLsJacBWrapper",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
    }
  }
  return iVar1;
}

Assistant:

static int cvLsJacBWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                           SUNMatrix JB, void* cvode_mem, N_Vector tmp1B,
                           N_Vector tmp2B, N_Vector tmp3B)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsJacBWrapper", &cv_mem, &ca_mem,
                               &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Forward solution from interpolation */
  retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint jacB routine (of type CVLsJacFnB) */
  return (cvlsB_mem->jacB(t, ca_mem->ca_ytmp, yB, fyB, JB,
                          cvB_mem->cv_user_data, tmp1B, tmp2B, tmp3B));
}